

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O0

int omp_target_disassociate_ptr(void *host_ptr,int device_num)

{
  bool bVar1;
  int iVar2;
  int in_ESI;
  long in_RDI;
  int rc;
  DeviceTy *Device;
  undefined4 in_stack_00000010;
  int in_stack_ffffffffffffffe0;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = -1;
  }
  else {
    iVar2 = omp_get_initial_device();
    if (in_ESI == iVar2) {
      local_4 = -1;
    }
    else {
      bVar1 = device_is_ready(in_stack_ffffffffffffffe0);
      if (bVar1) {
        std::vector<DeviceTy,_std::allocator<DeviceTy>_>::operator[](&Devices,(long)in_ESI);
        local_4 = DeviceTy::disassociatePtr
                            ((DeviceTy *)host_ptr,(void *)CONCAT44(device_num,in_stack_00000010));
      }
      else {
        local_4 = -1;
      }
    }
  }
  return local_4;
}

Assistant:

EXTERN int omp_target_disassociate_ptr(void *host_ptr, int device_num) {
  DP("Call to omp_target_disassociate_ptr with host_ptr " DPxMOD ", "
      "device_num %d\n", DPxPTR(host_ptr), device_num);

  if (!host_ptr) {
    DP("Call to omp_target_associate_ptr with invalid host_ptr\n");
    return OFFLOAD_FAIL;
  }

  if (device_num == omp_get_initial_device()) {
    DP("omp_target_disassociate_ptr: no association possible on the host\n");
    return OFFLOAD_FAIL;
  }

  if (!device_is_ready(device_num)) {
    DP("omp_target_disassociate_ptr returns OFFLOAD_FAIL\n");
    return OFFLOAD_FAIL;
  }

  DeviceTy& Device = Devices[device_num];
  int rc = Device.disassociatePtr(host_ptr);
  DP("omp_target_disassociate_ptr returns %d\n", rc);
  return rc;
}